

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void rr::initEdgeCCW(EdgeFunction *edge,HorizontalFill horizontalFill,VerticalFill verticalFill,
                    deInt64 x0,deInt64 y0,deInt64 x1,deInt64 y1)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  lVar1 = x1 - x0;
  if (y1 == y0) {
    bVar2 = lVar1 < 1;
    if (verticalFill == FILL_BOTTOM) {
      bVar2 = -1 < lVar1;
    }
  }
  else {
    bVar3 = y1 - y0 < 0;
    bVar2 = !bVar3;
    if (horizontalFill == FILL_LEFT) {
      bVar2 = y1 == y0 || bVar3;
    }
  }
  edge->a = y0 - y1;
  edge->b = lVar1;
  edge->c = x0 * y1 - x1 * y0;
  edge->inclusive = bVar2;
  return;
}

Assistant:

static inline void initEdgeCCW (EdgeFunction& edge, const HorizontalFill horizontalFill, const VerticalFill verticalFill, const deInt64 x0, const deInt64 y0, const deInt64 x1, const deInt64 y1)
{
	// \note See EdgeFunction documentation for details.

	const deInt64	xd			= x1-x0;
	const deInt64	yd			= y1-y0;
	bool			inclusive	= false;	//!< Inclusive in CCW orientation.

	if (yd == 0)
		inclusive = verticalFill == FILL_BOTTOM ? xd >= 0 : xd <= 0;
	else
		inclusive = horizontalFill == FILL_LEFT ? yd <= 0 : yd >= 0;

	edge.a			= (y0 - y1);
	edge.b			= (x1 - x0);
	edge.c			= x0*y1 - y0*x1;
	edge.inclusive	= inclusive; //!< \todo [pyry] Swap for CW triangles
}